

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::routing_table::log_node_failed(routing_table *this,node_id *nid,node_entry *ne)

{
  byte bVar1;
  dht_logger *pdVar2;
  undefined1 auVar3 [16];
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  int iVar6;
  time_point tVar7;
  difference_type in_RCX;
  endpoint *ep;
  uint uVar8;
  span<const_char> in;
  string local_88;
  string local_68;
  endpoint local_44;
  
  pdVar2 = this->m_log;
  if (pdVar2 != (dht_logger *)0x0) {
    iVar6 = (**pdVar2->_vptr_dht_logger)(pdVar2,2);
    if ((char)iVar6 != '\0') {
      pdVar2 = this->m_log;
      in.m_len = in_RCX;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_(&local_68,(aux *)nid,in);
      _Var5._M_p = local_68._M_dataplus._M_p;
      aux::union_endpoint::operator_cast_to_basic_endpoint(&local_44,&ne->endpoint);
      aux::print_endpoint_abi_cxx11_(&local_88,(aux *)&local_44,ep);
      _Var4._M_p = local_88._M_dataplus._M_p;
      bVar1 = ne->timeout_count;
      tVar7 = aux::time_now();
      uVar8 = (uint)bVar1;
      if (bVar1 == 0xff) {
        uVar8 = 0;
      }
      auVar3 = SEXT816((long)tVar7.__d.__r - (ne->first_seen).__d.__r) * SEXT816(0x112e0be826d694b3)
      ;
      (*pdVar2->_vptr_dht_logger[1])
                (pdVar2,2,"NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d",_Var5._M_p,
                 _Var4._M_p,(ulong)uVar8,(ulong)(bVar1 != 0xff),
                 (ulong)(uint)((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void routing_table::log_node_failed(node_id const& nid, node_entry const& ne) const
{
	if (m_log != nullptr && m_log->should_log(dht_logger::routing_table))
	{
		m_log->log(dht_logger::routing_table, "NODE FAILED id: %s ip: %s fails: %d pinged: %d up-time: %d"
			, aux::to_hex(nid).c_str(), aux::print_endpoint(ne.ep()).c_str()
			, ne.fail_count()
			, int(ne.pinged())
			, int(total_seconds(aux::time_now() - ne.first_seen)));
	}
}